

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType2.cpp
# Opt level: O1

KBOOL __thiscall
KDIS::DATA_TYPE::GridDataType2::operator==(GridDataType2 *this,GridDataType2 *Value)

{
  float *pfVar1;
  KBOOL KVar2;
  float *pfVar3;
  float *pfVar4;
  
  KVar2 = GridData::operator!=(&this->super_GridData,&Value->super_GridData);
  if ((!KVar2) &&
     (*(short *)&(this->super_GridData).field_0xc == *(short *)&(Value->super_GridData).field_0xc))
  {
    pfVar3 = (this->m_vf32Values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar1 = (this->m_vf32Values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pfVar4 = (Value->m_vf32Values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)pfVar1 - (long)pfVar3 ==
        (long)(Value->m_vf32Values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)pfVar4) {
      if (pfVar3 == pfVar1) {
        return pfVar3 == pfVar1;
      }
      if ((*pfVar3 == *pfVar4) && (!NAN(*pfVar3) && !NAN(*pfVar4))) {
        while( true ) {
          pfVar4 = pfVar4 + 1;
          pfVar3 = pfVar3 + 1;
          if (pfVar3 == pfVar1) {
            return pfVar3 == pfVar1;
          }
          if (*pfVar3 != *pfVar4) break;
          if (NAN(*pfVar3) || NAN(*pfVar4)) {
            return false;
          }
        }
        return false;
      }
    }
  }
  return false;
}

Assistant:

KBOOL GridDataType2::operator == ( const GridDataType2 & Value ) const
{
    if( GridData::operator != ( Value ) )           return false;
    if( m_ui16NumValues  != Value.m_ui16NumValues ) return false;
    if( m_vf32Values     != Value.m_vf32Values )    return false;
    return true;
}